

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O0

Vec_Wrd_t * Unm_ManComputeTruths(Unm_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Wrd_t *p_01;
  int *piVar3;
  Gia_Obj_t *pObj;
  word Entry;
  word uTruth;
  int iNode;
  int iObj;
  int k;
  int i;
  Vec_Wrd_t *vTruths;
  Vec_Wrd_t *vTruthsTemp;
  Unm_Man_t *p_local;
  
  vTruthsTemp = (Vec_Wrd_t *)p;
  iVar1 = Vec_IntSize(p->vUsed);
  p_01 = Vec_WrdAlloc(iVar1);
  iVar1 = Gia_ManObjNum(*(Gia_Man_t **)vTruthsTemp);
  vTruths = Vec_WrdStart(iVar1);
  iObj = 0;
  while( true ) {
    iVar1 = Vec_IntSize(*(Vec_Int_t **)(vTruthsTemp + 2));
    if (iVar1 <= iObj) {
      Vec_WrdFreeP(&vTruths);
      return p_01;
    }
    iVar1 = Vec_IntEntry(*(Vec_Int_t **)(vTruthsTemp + 2),iObj);
    iVar2 = Gia_ObjIsLut(*(Gia_Man_t **)vTruthsTemp,iVar1);
    if (iVar2 == 0) break;
    Vec_IntClear((Vec_Int_t *)vTruthsTemp[3].pArray);
    for (iNode = 0; iVar2 = Gia_ObjLutSize(*(Gia_Man_t **)vTruthsTemp,iVar1), iNode < iVar2;
        iNode = iNode + 1) {
      piVar3 = Gia_ObjLutFanins(*(Gia_Man_t **)vTruthsTemp,iVar1);
      Vec_IntPush((Vec_Int_t *)vTruthsTemp[3].pArray,piVar3[iNode]);
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)vTruthsTemp[3].pArray);
    if (6 < iVar2) {
      __assert_fail("Vec_IntSize(p->vLeaves) <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                    ,0xec,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
    }
    p_00 = *(Gia_Man_t **)vTruthsTemp;
    pObj = Gia_ManObj(*(Gia_Man_t **)vTruthsTemp,iVar1);
    Entry = Shr_ManComputeTruth6(p_00,pObj,(Vec_Int_t *)vTruthsTemp[3].pArray,vTruths);
    Vec_WrdPush(p_01,Entry);
    iObj = iObj + 1;
  }
  __assert_fail("Gia_ObjIsLut(p->pGia, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                ,0xe7,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
}

Assistant:

Vec_Wrd_t * Unm_ManComputeTruths( Unm_Man_t * p )
{
    Vec_Wrd_t * vTruthsTemp, * vTruths;
    int i, k, iObj, iNode;
    word uTruth;
    vTruths = Vec_WrdAlloc( Vec_IntSize(p->vUsed) );
    vTruthsTemp = Vec_WrdStart( Gia_ManObjNum(p->pGia) );
    Vec_IntForEachEntry( p->vUsed, iObj, i )
    {
        assert( Gia_ObjIsLut(p->pGia, iObj) );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, iObj, iNode, k )
            Vec_IntPush( p->vLeaves, iNode );
        assert( Vec_IntSize(p->vLeaves) <= 6 );
        // compute truth table 
        uTruth = Shr_ManComputeTruth6( p->pGia, Gia_ManObj(p->pGia, iObj), p->vLeaves, vTruthsTemp );
        Vec_WrdPush( vTruths, uTruth );
//        if ( i % 100 == 0 )
//            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 6 ), printf( "\n" );
    }
    Vec_WrdFreeP( &vTruthsTemp );
    return vTruths;
}